

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostasyn.c
# Opt level: O0

CURLcode Curl_addrinfo_callback(Curl_easy *data,int status,Curl_addrinfo *ai)

{
  CURLcode local_2c;
  Curl_dns_entry *pCStack_28;
  CURLcode result;
  Curl_dns_entry *dns;
  Curl_addrinfo *ai_local;
  int status_local;
  Curl_easy *data_local;
  
  pCStack_28 = (Curl_dns_entry *)0x0;
  local_2c = CURLE_OK;
  (data->state).async.status = status;
  if (status == 0) {
    if (ai == (Curl_addrinfo *)0x0) {
      local_2c = CURLE_OUT_OF_MEMORY;
    }
    else {
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCStack_28 = Curl_cache_addr(data,ai,(data->state).async.hostname,(data->state).async.port);
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      if (pCStack_28 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(ai);
        local_2c = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  (data->state).async.dns = pCStack_28;
  (data->state).async.field_0x28 = (data->state).async.field_0x28 & 0xfe | 1;
  return local_2c;
}

Assistant:

CURLcode Curl_addrinfo_callback(struct Curl_easy *data,
                                int status,
                                struct Curl_addrinfo *ai)
{
  struct Curl_dns_entry *dns = NULL;
  CURLcode result = CURLE_OK;

  data->state.async.status = status;

  if(CURL_ASYNC_SUCCESS == status) {
    if(ai) {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      dns = Curl_cache_addr(data, ai,
                            data->state.async.hostname,
                            data->state.async.port);
      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* failed to store, cleanup and return error */
        Curl_freeaddrinfo(ai);
        result = CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  data->state.async.dns = dns;

 /* Set async.done TRUE last in this function since it may be used multi-
    threaded and once this is TRUE the other thread may read fields from the
    async struct */
  data->state.async.done = TRUE;

  /* IPv4: The input hostent struct will be freed by ares when we return from
     this function */
  return result;
}